

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O3

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_6()::RemoveWriter>::
visitDefault<slang::syntax::AssignmentPatternItemSyntax&>
          (SyntaxVisitor<CATCH2_INTERNAL_TEST_6()::RemoveWriter> *this,
          AssignmentPatternItemSyntax *node)

{
  size_t sVar1;
  SyntaxNode *node_00;
  size_t sVar2;
  uint uVar3;
  
  sVar1 = SyntaxNode::getChildCount(&node->super_SyntaxNode);
  if (sVar1 != 0) {
    uVar3 = 1;
    sVar1 = 0;
    do {
      node_00 = SyntaxNode::childNode(&node->super_SyntaxNode,sVar1);
      if (node_00 == (SyntaxNode *)0x0) {
        SyntaxNode::childToken(&node->super_SyntaxNode,sVar1);
      }
      else {
        detail::visitSyntaxNode<slang::syntax::SyntaxNode,CATCH2_INTERNAL_TEST_6()::RemoveWriter>
                  (node_00,(RemoveWriter *)this);
      }
      sVar1 = (size_t)uVar3;
      sVar2 = SyntaxNode::getChildCount(&node->super_SyntaxNode);
      uVar3 = uVar3 + 1;
    } while (sVar1 < sVar2);
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }